

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_id_t itree_enum(void)

{
  uint uVar1;
  cell_t *pcVar2;
  cell_index_t cVar3;
  cell_index_t cVar4;
  
  pcVar2 = base->cell;
  cVar4 = pcVar2[posn].sib;
  if (cVar4 == 0xffffffff) {
    cVar3 = pcVar2[right].sib;
    if (cVar3 == 0xffffffff) {
      uVar1 = pcVar2[left].sib;
      if ((ulong)uVar1 == 0xffffffff) {
        return 0xffffffff;
      }
      cVar3 = pcVar2[uVar1].child;
      left = uVar1;
    }
    cVar4 = pcVar2[cVar3].child;
    right = cVar3;
  }
  posn = cVar4;
  return pcVar2[cVar4].child;
}

Assistant:

cell_id_t
itree_enum()
{
    cell_index_t nxt;

    nxt = base->cell[posn].sib;		/* get next posn (given left and right) */
    if (nxt != NULL_INDEX) {
	/* exists, so set the posn leaf node to the next one */
	posn = nxt;
    }
    else {
	/* no next posn (given left and right) */
	/* therefore get the next right context if any */

	nxt = base->cell[right].sib;
	if (nxt != NULL_INDEX) {
	    /* found a next right context, so save it */
	    right = nxt;

	    /* set the posn to the first position given the new right */
	    posn = base->cell[right].child;
	}
	else {
	    /* no next right context exists */
	    /* therefore get a new left context if any */
	    nxt = base->cell[left].sib;
	    if (nxt != NULL_INDEX) {
		/* a next left context exists so save it */
		left = nxt;
		/* get the first right context given the left */
		right = base->cell[left].child;

		/* get the first posn given the left and right */
		posn = base->cell[right].child;
	    }
	    else {
		return NULL_INDEX;	/* no more left contexts, so the
					   whole tree for this base phone
					   has been enumerated */
	    }
	}
    }

    /* if we arrive here, posn will reference the cell with the
       next triphone id */

    return base->cell[posn].child;
}